

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O2

void update_box(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,boxptr boxp)

{
  uint uVar1;
  uchar **ppuVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  short *psVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long local_48;
  
  ppuVar2 = oim->pixels;
  uVar1 = *(uint *)&nim->pixels;
  uVar17 = (ulong)uVar1;
  iVar19 = *(int *)((long)&nim->pixels + 4);
  lVar20 = (long)iVar19;
  iVar10 = nim->sx;
  lVar12 = (long)iVar10;
  iVar3 = nim->sy;
  lVar4 = (long)iVar3;
  iVar11 = nim->colorsTotal;
  local_48 = (long)iVar11;
  iVar6 = nim->red[0];
  if ((int)uVar1 < iVar19) {
    for (uVar17 = (ulong)(int)uVar1; lVar15 = lVar12 << 6, lVar14 = lVar12, (long)uVar17 <= lVar20;
        uVar17 = uVar17 + 1) {
      for (; lVar14 <= lVar4; lVar14 = lVar14 + 1) {
        for (lVar13 = local_48; (int)lVar13 <= iVar6; lVar13 = lVar13 + 1) {
          if (*(short *)(ppuVar2[uVar17] + lVar13 * 2 + lVar15) != 0) {
            *(int *)&nim->pixels = (int)uVar17;
            goto LAB_00121aba;
          }
        }
        lVar15 = lVar15 + 0x40;
      }
    }
    uVar17 = (ulong)uVar1;
  }
LAB_00121aba:
  iVar7 = (int)uVar17;
  uVar18 = uVar17;
  if (iVar7 < iVar19) {
    for (; lVar15 = lVar12 << 6, lVar14 = lVar12, iVar7 <= lVar20; lVar20 = lVar20 + -1) {
      for (; lVar14 <= lVar4; lVar14 = lVar14 + 1) {
        for (lVar13 = local_48; (int)lVar13 <= iVar6; lVar13 = lVar13 + 1) {
          if (*(short *)(ppuVar2[lVar20] + lVar13 * 2 + lVar15) != 0) {
            iVar19 = (int)lVar20;
            *(int *)((long)&nim->pixels + 4) = iVar19;
            goto LAB_00121b15;
          }
        }
        lVar15 = lVar15 + 0x40;
      }
    }
LAB_00121b15:
    uVar18 = uVar17 & 0xffffffff;
  }
  if (iVar10 < iVar3) {
    lVar20 = lVar12 << 6;
    for (; lVar15 = (long)(int)uVar18, lVar12 <= lVar4; lVar12 = lVar12 + 1) {
      for (; lVar15 <= iVar19; lVar15 = lVar15 + 1) {
        for (lVar14 = local_48; (int)lVar14 <= iVar6; lVar14 = lVar14 + 1) {
          if (*(short *)(ppuVar2[lVar15] + lVar14 * 2 + lVar20) != 0) {
            iVar10 = (int)lVar12;
            nim->sx = iVar10;
            goto LAB_00121b70;
          }
        }
      }
      lVar20 = lVar20 + 0x40;
    }
LAB_00121b70:
    uVar18 = uVar17 & 0xffffffff;
  }
  if (iVar10 < iVar3) {
    lVar12 = lVar4 << 6;
    for (; lVar20 = (long)(int)uVar18, iVar10 <= lVar4; lVar4 = lVar4 + -1) {
      for (; lVar20 <= iVar19; lVar20 = lVar20 + 1) {
        for (lVar15 = local_48; (int)lVar15 <= iVar6; lVar15 = lVar15 + 1) {
          if (*(short *)(ppuVar2[lVar20] + lVar15 * 2 + lVar12) != 0) {
            iVar3 = (int)lVar4;
            nim->sy = iVar3;
            goto LAB_00121bc9;
          }
        }
      }
      lVar12 = lVar12 + -0x40;
    }
LAB_00121bc9:
    uVar18 = uVar17 & 0xffffffff;
  }
  lVar4 = (long)iVar6;
  iVar16 = (int)uVar18;
  if (iVar11 < iVar6) {
    for (; lVar12 = (long)iVar16, local_48 <= lVar4; local_48 = local_48 + 1) {
      for (; lVar12 <= iVar19; lVar12 = lVar12 + 1) {
        psVar9 = (short *)(ppuVar2[lVar12] + local_48 * 2 + (long)iVar10 * 0x40);
        for (iVar5 = iVar10; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
          if (*psVar9 != 0) {
            iVar11 = (int)local_48;
            nim->colorsTotal = iVar11;
            goto LAB_00121c3b;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
    }
  }
LAB_00121c3b:
  iVar5 = iVar16;
  if (iVar11 < iVar6) {
    for (; lVar12 = (long)iVar16, iVar5 = (int)uVar18, iVar11 <= lVar4; lVar4 = lVar4 + -1) {
      for (; lVar12 <= iVar19; lVar12 = lVar12 + 1) {
        psVar9 = (short *)(ppuVar2[lVar12] + lVar4 * 2 + (long)iVar10 * 0x40);
        for (iVar5 = iVar10; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
          if (*psVar9 != 0) {
            iVar6 = (int)lVar4;
            nim->red[0] = iVar6;
            iVar5 = iVar7;
            goto LAB_00121cbd;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
      uVar18 = uVar17 & 0xffffffff;
    }
  }
LAB_00121cbd:
  iVar7 = (iVar19 - iVar5) * 0x10;
  iVar5 = (iVar3 - iVar10) * 0xc;
  iVar8 = (iVar6 - iVar11) * 8;
  nim->red[1] = iVar8 * iVar8 + iVar7 * iVar7 + iVar5 * iVar5;
  lVar4 = 0;
  for (lVar12 = (long)iVar16; lVar20 = (long)iVar10, lVar12 <= iVar19; lVar12 = lVar12 + 1) {
    for (; lVar20 <= iVar3; lVar20 = lVar20 + 1) {
      psVar9 = (short *)(ppuVar2[lVar12] + (long)iVar11 * 2 + lVar20 * 0x40);
      for (iVar7 = iVar11; iVar7 <= iVar6; iVar7 = iVar7 + 1) {
        lVar4 = (lVar4 + 1) - (ulong)(*psVar9 == 0);
        psVar9 = psVar9 + 1;
      }
    }
  }
  *(long *)(nim->red + 3) = lVar4;
  return;
}

Assistant:

LOCAL (void)
update_box (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize, boxptr boxp)
{
	hist3d histogram = cquantize->histogram;
	histptr histp;
	int c0, c1, c2;
	int c0min, c0max, c1min, c1max, c2min, c2max;
	INT32 dist0, dist1, dist2;
	long ccount;
	(void)oim;
	(void)nim;

	c0min = boxp->c0min;
	c0max = boxp->c0max;
	c1min = boxp->c1min;
	c1max = boxp->c1max;
	c2min = boxp->c2min;
	c2max = boxp->c2max;

	if (c0max > c0min)
		for (c0 = c0min; c0 <= c0max; c0++)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0min = c0min = c0;
						goto have_c0min;
					}
			}
have_c0min:
	if (c0max > c0min)
		for (c0 = c0max; c0 >= c0min; c0--)
			for (c1 = c1min; c1 <= c1max; c1++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c0max = c0max = c0;
						goto have_c0max;
					}
			}
have_c0max:
	if (c1max > c1min)
		for (c1 = c1min; c1 <= c1max; c1++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1min = c1min = c1;
						goto have_c1min;
					}
			}
have_c1min:
	if (c1max > c1min)
		for (c1 = c1max; c1 >= c1min; c1--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1][c2min];
				for (c2 = c2min; c2 <= c2max; c2++)
					if (*histp++ != 0) {
						boxp->c1max = c1max = c1;
						goto have_c1max;
					}
			}
have_c1max:
	if (c2max > c2min)
		for (c2 = c2min; c2 <= c2max; c2++)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2min = c2min = c2;
						goto have_c2min;
					}
			}
have_c2min:
	if (c2max > c2min)
		for (c2 = c2max; c2 >= c2min; c2--)
			for (c0 = c0min; c0 <= c0max; c0++) {
				histp = &histogram[c0][c1min][c2];
				for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
					if (*histp != 0) {
						boxp->c2max = c2max = c2;
						goto have_c2max;
					}
			}
have_c2max:

	/* Update box volume.
	 * We use 2-norm rather than real volume here; this biases the method
	 * against making long narrow boxes, and it has the side benefit that
	 * a box is splittable iff norm > 0.
	 * Since the differences are expressed in histogram-cell units,
	 * we have to shift back to JSAMPLE units to get consistent distances;
	 * after which, we scale according to the selected distance scale factors.
	 */
	dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
	dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
	dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
	boxp->volume = dist0 * dist0 + dist1 * dist1 + dist2 * dist2;

	/* Now scan remaining volume of box and compute population */
	ccount = 0;
	for (c0 = c0min; c0 <= c0max; c0++)
		for (c1 = c1min; c1 <= c1max; c1++) {
			histp = &histogram[c0][c1][c2min];
			for (c2 = c2min; c2 <= c2max; c2++, histp++)
				if (*histp != 0) {
					ccount++;
				}
		}
	boxp->colorcount = ccount;
}